

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sexp_conflict sexp_open_pipe_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  int iVar1;
  double dVar2;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res0;
  sexp_conflict res;
  int tmp0 [2];
  int err;
  int i;
  sexp_conflict *local_48;
  undefined8 local_40;
  sexp_conflict local_38;
  sexp_conflict local_30;
  int local_28 [8];
  long local_8;
  
  local_28[3] = 0;
  local_28[2] = 0;
  local_38 = (sexp_conflict)0x43e;
  local_8 = in_RDI;
  memset(&local_48,0,0x10);
  local_48 = &local_38;
  local_40 = *(undefined8 *)(local_8 + 0x6080);
  *(sexp_conflict ***)(local_8 + 0x6080) = &local_48;
  iVar1 = pipe(local_28);
  if (iVar1 == 0) {
    local_38 = (sexp_conflict)0x23e;
    local_28[2] = 0;
    for (local_28[3] = 1; -1 < local_28[3]; local_28[3] = local_28[3] + -1) {
      sexp_push_op(local_8,&local_38,0x43e);
      dVar2 = (double)sexp_make_fileno_op(local_8,0,2,(long)local_28[local_28[3]] << 1 | 1,0x3e);
      (local_38->value).flonum = dVar2;
    }
    local_30 = local_38;
  }
  else {
    local_30 = (sexp_conflict)0x3e;
  }
  *(undefined8 *)(local_8 + 0x6080) = local_40;
  return local_30;
}

Assistant:

sexp sexp_open_pipe_stub (sexp ctx, sexp self, sexp_sint_t n) {
  int i = 0, err = 0;
  int tmp0[2];
  sexp res;
  sexp_gc_var1(res0);
  sexp_gc_preserve1(ctx, res0);
  err = pipe(tmp0);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res0 = SEXP_NULL;
  for (i=2-1; i>=0; i--) {
    sexp_push(ctx, res0, SEXP_VOID);
    sexp_car(res0) = sexp_make_fileno(ctx, sexp_make_fixnum(tmp0[i]), SEXP_FALSE);
  }
  res = res0;
  }
  sexp_gc_release1(ctx);
  return res;
}